

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  size_t sVar1;
  int *__src;
  secp256k1_context *psVar2;
  secp256k1_context *psVar3;
  undefined4 in_register_00000034;
  void *__dest;
  uint flags_00;
  
  __dest = (void *)CONCAT44(in_register_00000034,flags);
  secp256k1_selftest();
  flags_00 = flags;
  sVar1 = secp256k1_context_preallocated_size(flags);
  if (sVar1 == 0) {
    return (secp256k1_context *)0x0;
  }
  if (prealloc == (void *)0x0) {
    secp256k1_context_preallocated_create_cold_2();
  }
  else {
    *(secp256k1_callback *)((long)prealloc + 0xa0) = default_illegal_callback;
    *(secp256k1_callback *)((long)prealloc + 0xb0) = default_error_callback;
    if ((char)flags == '\x01') {
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)prealloc,(uchar *)0x0);
      *(undefined4 *)prealloc = 1;
      *(uint *)((long)prealloc + 0xc0) = flags >> 10 & 1;
      return (secp256k1_context *)prealloc;
    }
  }
  secp256k1_context_preallocated_create_cold_1();
  __src = (int *)secp256k1_context_preallocated_size(flags_00);
  psVar2 = (secp256k1_context *)malloc((size_t)__src);
  if (psVar2 == (secp256k1_context *)0x0) {
    secp256k1_context_create_cold_1();
    if (__src == (int *)0x0) {
      secp256k1_context_preallocated_clone_cold_3();
    }
    else if (__dest != (void *)0x0) {
      if (*__src == 0) {
        secp256k1_context_preallocated_clone_cold_1();
        return (secp256k1_context *)0x0;
      }
      psVar2 = (secp256k1_context *)memcpy(__dest,__src,200);
      return psVar2;
    }
    secp256k1_context_preallocated_clone_cold_2();
    return (secp256k1_context *)0x0;
  }
  psVar3 = secp256k1_context_preallocated_create(psVar2,flags_00);
  if (psVar3 == (secp256k1_context *)0x0) {
    free(psVar2);
    psVar2 = (secp256k1_context *)0x0;
  }
  return psVar2;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    secp256k1_selftest();

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}